

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * google::protobuf::compiler::php::anon_unknown_2::
         RootPhpNamespace<google::protobuf::EnumDescriptor>
                   (string *__return_storage_ptr__,EnumDescriptor *desc,Options *options)

{
  bool bVar1;
  FileDescriptor *pFVar2;
  FileOptions *pFVar3;
  ulong uVar4;
  string *full_name;
  allocator local_3d [20];
  allocator local_29;
  string *local_28;
  string *php_namespace;
  Options *options_local;
  EnumDescriptor *desc_local;
  
  php_namespace = (string *)options;
  options_local = (Options *)desc;
  desc_local = (EnumDescriptor *)__return_storage_ptr__;
  pFVar2 = EnumDescriptor::file(desc);
  pFVar3 = FileDescriptor::options(pFVar2);
  bVar1 = FileOptions::has_php_namespace(pFVar3);
  if (bVar1) {
    pFVar2 = EnumDescriptor::file((EnumDescriptor *)options_local);
    pFVar3 = FileDescriptor::options(pFVar2);
    local_28 = FileOptions::php_namespace_abi_cxx11_(pFVar3);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_28);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_29);
      std::allocator<char>::~allocator((allocator<char> *)&local_29);
    }
  }
  else {
    pFVar2 = EnumDescriptor::file((EnumDescriptor *)options_local);
    FileDescriptor::package_abi_cxx11_(pFVar2);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      pFVar2 = EnumDescriptor::file((EnumDescriptor *)options_local);
      full_name = FileDescriptor::package_abi_cxx11_(pFVar2);
      PhpName(__return_storage_ptr__,full_name,(Options *)php_namespace);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",local_3d);
      std::allocator<char>::~allocator((allocator<char> *)local_3d);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string RootPhpNamespace(const DescriptorType* desc,
                             const Options& options) {
  if (desc->file()->options().has_php_namespace()) {
    const std::string& php_namespace = desc->file()->options().php_namespace();
    if (!php_namespace.empty()) {
      return php_namespace;
    }
    return "";
  }

  if (!desc->file()->package().empty()) {
    return PhpName(desc->file()->package(), options);
  }
  return "";
}